

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedSnapshotRecord.cpp
# Opt level: O2

void __thiscall
cali::CompressedSnapshotRecordView::CompressedSnapshotRecordView
          (CompressedSnapshotRecordView *this,uchar *buf,size_t *inc)

{
  ulong uVar1;
  size_t i;
  ulong uVar2;
  size_t local_30;
  
  this->m_buffer = buf;
  local_30 = 1;
  uVar1 = (ulong)*buf;
  this->m_num_nodes = uVar1;
  for (uVar2 = 0; uVar2 < uVar1; uVar2 = uVar2 + 1) {
    vldec_u64(buf + local_30,&local_30);
    uVar1 = this->m_num_nodes;
  }
  this->m_imm_len = 0;
  this->m_imm_pos = local_30;
  uVar1 = (ulong)buf[local_30];
  this->m_num_imm = uVar1;
  local_30 = local_30 + 1;
  for (uVar2 = 0; uVar2 < uVar1; uVar2 = uVar2 + 1) {
    vldec_u64(buf + local_30,&local_30);
    cali_variant_unpack(buf + local_30,&local_30,(_Bool *)0x0);
    uVar1 = this->m_num_imm;
  }
  this->m_imm_len = local_30 - this->m_imm_pos;
  *inc = *inc + local_30;
  return;
}

Assistant:

CompressedSnapshotRecordView::CompressedSnapshotRecordView(const unsigned char* buf, size_t* inc) : m_buffer(buf)
{
    size_t pos = 0;

    m_num_nodes = buf[pos++];

    for (size_t i = 0; i < m_num_nodes; ++i)
        vldec_u64(buf + pos, &pos);

    m_imm_len = 0;
    m_imm_pos = pos;
    m_num_imm = buf[pos++];

    for (size_t i = 0; i < m_num_imm; ++i) {
        vldec_u64(buf + pos, &pos);
        Variant::unpack(buf + pos, &pos, nullptr);
    }

    m_imm_len = pos - m_imm_pos;
    *inc += pos;
}